

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

uint rlLoadTexture(void *data,int width,int height,int format,int mipmapCount)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *text;
  int iVar4;
  uint id;
  uint local_6c;
  uint local_68;
  uint local_64;
  int local_60;
  uint glType;
  uint glFormat;
  uint glInternalFormat;
  void *local_50;
  GLint swizzleMask [4];
  
  (*glad_glBindTexture)(0xde1,0);
  id = 0;
  if ((format - 0xfU < 0xfffffffc) || (RLGL.ExtSupported.texCompDXT != false)) {
    if ((format == 0xf) && (RLGL.ExtSupported.texCompETC1 == false)) {
      text = "GL: ETC1 compressed texture format not supported";
    }
    else {
      uVar1 = format & 0xfffffffe;
      if ((uVar1 == 0x10) && (RLGL.ExtSupported.texCompETC2 == false)) {
        text = "GL: ETC2 compressed texture format not supported";
      }
      else if ((uVar1 == 0x12) && (RLGL.ExtSupported.texCompPVRT == false)) {
        text = "GL: PVRT compressed texture format not supported";
      }
      else if ((uVar1 == 0x14) && (RLGL.ExtSupported.texCompASTC == false)) {
        text = "GL: ASTC compressed texture format not supported";
      }
      else {
        local_50 = data;
        (*glad_glPixelStorei)(0xcf5,1);
        (*glad_glGenTextures)(1,&id);
        (*glad_glBindTexture)(0xde1,id);
        iVar4 = 0;
        local_60 = 0;
        if (0 < mipmapCount) {
          local_60 = mipmapCount;
        }
        local_6c = height;
        local_68 = width;
        local_64 = mipmapCount;
        for (iVar3 = 0; local_60 != iVar3; iVar3 = iVar3 + 1) {
          iVar2 = rlGetPixelDataSize(width,height,format);
          rlGetGlTextureFormats(format,&glInternalFormat,&glFormat,&glType);
          if (glInternalFormat != 0xffffffff) {
            if (format < 0xb) {
              (*glad_glTexImage2D)
                        (0xde1,iVar3,glInternalFormat,width,height,0,glFormat,glType,
                         (void *)((long)iVar4 + (long)local_50));
            }
            else {
              (*glad_glCompressedTexImage2D)
                        (0xde1,iVar3,glInternalFormat,width,height,0,iVar2,
                         (void *)((long)iVar4 + (long)local_50));
            }
            if (format == 2) {
              swizzleMask[3] = 0x1904;
            }
            else {
              if (format != 1) goto LAB_00115cf1;
              swizzleMask[3] = 1;
            }
            swizzleMask[0] = 0x1903;
            swizzleMask[1] = 0x1903;
            swizzleMask[2] = 0x1903;
            (*glad_glTexParameteriv)(0xde1,0x8e46,swizzleMask);
          }
LAB_00115cf1:
          width = width / 2;
          height = height / 2;
          iVar4 = iVar4 + iVar2;
          if (width < 2) {
            width = 1;
          }
          if (height < 2) {
            height = 1;
          }
        }
        (*glad_glTexParameteri)(0xde1,0x2802,0x2901);
        (*glad_glTexParameteri)(0xde1,0x2803,0x2901);
        (*glad_glTexParameteri)(0xde1,0x2800,0x2600);
        (*glad_glTexParameteri)(0xde1,0x2801,0x2600);
        uVar1 = local_64;
        if (1 < (int)local_64) {
          (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
          (*glad_glTexParameteri)(0xde1,0x2801,0x2703);
        }
        (*glad_glBindTexture)(0xde1,0);
        if (id != 0) {
          TraceLog(3,"TEXTURE: [ID %i] Texture loaded successfully (%ix%i - %i mipmaps)",(ulong)id,
                   (ulong)local_68,(ulong)local_6c,(ulong)uVar1);
          return id;
        }
        text = "TEXTURE: Failed to load texture";
      }
    }
  }
  else {
    text = "GL: DXT compressed texture format not supported";
  }
  TraceLog(4,text);
  return id;
}

Assistant:

unsigned int rlLoadTexture(void *data, int width, int height, int format, int mipmapCount)
{
    glBindTexture(GL_TEXTURE_2D, 0);    // Free any old binding

    unsigned int id = 0;

    // Check texture format support by OpenGL 1.1 (compressed textures not supported)
#if defined(GRAPHICS_API_OPENGL_11)
    if (format >= PIXELFORMAT_COMPRESSED_DXT1_RGB)
    {
        TRACELOG(LOG_WARNING, "GL: OpenGL 1.1 does not support GPU compressed texture formats");
        return id;
    }
#else
    if ((!RLGL.ExtSupported.texCompDXT) && ((format == PIXELFORMAT_COMPRESSED_DXT1_RGB) || (format == PIXELFORMAT_COMPRESSED_DXT1_RGBA) ||
        (format == PIXELFORMAT_COMPRESSED_DXT3_RGBA) || (format == PIXELFORMAT_COMPRESSED_DXT5_RGBA)))
    {
        TRACELOG(LOG_WARNING, "GL: DXT compressed texture format not supported");
        return id;
    }
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    if ((!RLGL.ExtSupported.texCompETC1) && (format == PIXELFORMAT_COMPRESSED_ETC1_RGB))
    {
        TRACELOG(LOG_WARNING, "GL: ETC1 compressed texture format not supported");
        return id;
    }

    if ((!RLGL.ExtSupported.texCompETC2) && ((format == PIXELFORMAT_COMPRESSED_ETC2_RGB) || (format == PIXELFORMAT_COMPRESSED_ETC2_EAC_RGBA)))
    {
        TRACELOG(LOG_WARNING, "GL: ETC2 compressed texture format not supported");
        return id;
    }

    if ((!RLGL.ExtSupported.texCompPVRT) && ((format == PIXELFORMAT_COMPRESSED_PVRT_RGB) || (format == PIXELFORMAT_COMPRESSED_PVRT_RGBA)))
    {
        TRACELOG(LOG_WARNING, "GL: PVRT compressed texture format not supported");
        return id;
    }

    if ((!RLGL.ExtSupported.texCompASTC) && ((format == PIXELFORMAT_COMPRESSED_ASTC_4x4_RGBA) || (format == PIXELFORMAT_COMPRESSED_ASTC_8x8_RGBA)))
    {
        TRACELOG(LOG_WARNING, "GL: ASTC compressed texture format not supported");
        return id;
    }
#endif
#endif  // GRAPHICS_API_OPENGL_11

    glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

    glGenTextures(1, &id);              // Generate texture id

    glBindTexture(GL_TEXTURE_2D, id);

    int mipWidth = width;
    int mipHeight = height;
    int mipOffset = 0;          // Mipmap data offset

    // Load the different mipmap levels
    for (int i = 0; i < mipmapCount; i++)
    {
        unsigned int mipSize = rlGetPixelDataSize(mipWidth, mipHeight, format);

        unsigned int glInternalFormat, glFormat, glType;
        rlGetGlTextureFormats(format, &glInternalFormat, &glFormat, &glType);

        TRACELOGD("TEXTURE: Load mipmap level %i (%i x %i), size: %i, offset: %i", i, mipWidth, mipHeight, mipSize, mipOffset);

        if (glInternalFormat != -1)
        {
            if (format < PIXELFORMAT_COMPRESSED_DXT1_RGB) glTexImage2D(GL_TEXTURE_2D, i, glInternalFormat, mipWidth, mipHeight, 0, glFormat, glType, (unsigned char *)data + mipOffset);
#if !defined(GRAPHICS_API_OPENGL_11)
            else glCompressedTexImage2D(GL_TEXTURE_2D, i, glInternalFormat, mipWidth, mipHeight, 0, mipSize, (unsigned char *)data + mipOffset);
#endif

#if defined(GRAPHICS_API_OPENGL_33)
            if (format == PIXELFORMAT_UNCOMPRESSED_GRAYSCALE)
            {
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_ONE };
                glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_RGBA, swizzleMask);
            }
            else if (format == PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA)
            {
#if defined(GRAPHICS_API_OPENGL_21)
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_ALPHA };
#elif defined(GRAPHICS_API_OPENGL_33)
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_GREEN };
#endif
                glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_RGBA, swizzleMask);
            }
#endif
        }

        mipWidth /= 2;
        mipHeight /= 2;
        mipOffset += mipSize;

        // Security check for NPOT textures
        if (mipWidth < 1) mipWidth = 1;
        if (mipHeight < 1) mipHeight = 1;
    }

    // Texture parameters configuration
    // NOTE: glTexParameteri does NOT affect texture uploading, just the way it's used
#if defined(GRAPHICS_API_OPENGL_ES2)
    // NOTE: OpenGL ES 2.0 with no GL_OES_texture_npot support (i.e. WebGL) has limited NPOT support, so CLAMP_TO_EDGE must be used
    if (RLGL.ExtSupported.texNPOT)
    {
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);       // Set texture to repeat on x-axis
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);       // Set texture to repeat on y-axis
    }
    else
    {
        // NOTE: If using negative texture coordinates (LoadOBJ()), it does not work!
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);       // Set texture to clamp on x-axis
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);       // Set texture to clamp on y-axis
    }
#else
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);       // Set texture to repeat on x-axis
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);       // Set texture to repeat on y-axis
#endif

    // Magnification and minification filters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);  // Alternative: GL_LINEAR
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);  // Alternative: GL_LINEAR

#if defined(GRAPHICS_API_OPENGL_33)
    if (mipmapCount > 1)
    {
        // Activate Trilinear filtering if mipmaps are available
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
    }
#endif

    // At this point we have the texture loaded in GPU and texture parameters configured

    // NOTE: If mipmaps were not in data, they are not generated automatically

    // Unbind current texture
    glBindTexture(GL_TEXTURE_2D, 0);

    if (id > 0) TRACELOG(LOG_INFO, "TEXTURE: [ID %i] Texture loaded successfully (%ix%i - %i mipmaps)", id, width, height, mipmapCount);
    else TRACELOG(LOG_WARNING, "TEXTURE: Failed to load texture");

    return id;
}